

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O2

tnt_iter * tnt_iter_reply(tnt_iter *i,tnt_stream *s)

{
  tnt_iter *ptVar1;
  
  ptVar1 = tnt_iter_init(i);
  if (ptVar1 != (tnt_iter *)0x0) {
    ptVar1->type = TNT_ITER_REPLY;
    ptVar1->next = tnt_iter_reply_next;
    ptVar1->rewind = (_func_void_tnt_iter_ptr *)0x0;
    ptVar1->free = tnt_iter_reply_free;
    (ptVar1->data).reply.s = s;
    tnt_reply_init(&(ptVar1->data).reply.r);
  }
  return ptVar1;
}

Assistant:

struct tnt_iter *tnt_iter_reply(struct tnt_iter *i, struct tnt_stream *s) {
	i = tnt_iter_init(i);
	if (i == NULL)
		return NULL;
	i->type = TNT_ITER_REPLY;
	i->next = tnt_iter_reply_next;
	i->rewind = NULL;
	i->free = tnt_iter_reply_free;
	struct tnt_iter_reply *ir = TNT_IREPLY(i);
	ir->s = s;
	tnt_reply_init(&ir->r);
	return i;
}